

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::cmState(cmState *this)

{
  cmCacheManager *this_00;
  cmState *this_local;
  
  std::
  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
  ::map(&this->PropertyDefinitions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->EnabledLanguages);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
  ::map(&this->Commands);
  cmPropertyMap::cmPropertyMap(&this->GlobalProperties);
  cmLinkedTree<cmState::BuildsystemDirectoryStateType>::cmLinkedTree(&this->BuildsystemDirectory);
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  cmLinkedTree(&this->ExecutionListFiles);
  cmLinkedTree<cmState::PolicyStackEntry>::cmLinkedTree(&this->PolicyStack);
  cmLinkedTree<cmState::SnapshotDataType>::cmLinkedTree(&this->SnapshotData);
  cmLinkedTree<cmDefinitions>::cmLinkedTree(&this->VarTree);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->SourceDirectoryComponents);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->BinaryDirectoryComponents);
  std::__cxx11::string::string((string *)&this->SourceDirectory);
  std::__cxx11::string::string((string *)&this->BinaryDirectory);
  this->IsInTryCompile = false;
  this->WindowsShell = false;
  this->WindowsVSIDE = false;
  this->WatcomWMake = false;
  this->MinGWMake = false;
  this->NMake = false;
  this->MSYSShell = false;
  this_00 = (cmCacheManager *)operator_new(0x40);
  cmCacheManager::cmCacheManager(this_00);
  this->CacheManager = this_00;
  return;
}

Assistant:

cmState::cmState()
  : IsInTryCompile(false),
    WindowsShell(false),
    WindowsVSIDE(false),
    WatcomWMake(false),
    MinGWMake(false),
    NMake(false),
    MSYSShell(false)
{
  this->CacheManager = new cmCacheManager;
}